

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_183fe20::AV1LosslessFrameSizeTests::HandleDecodeResult
          (AV1LosslessFrameSizeTests *this,aom_codec_err_t res_dec,Decoder *decoder)

{
  bool bVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  pointer *__ptr;
  SEARCH_METHODS *message;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  undefined8 *local_20;
  aom_codec_err_t local_14;
  
  local_14 = res_dec;
  testing::internal::CmpHelperEQ<int,aom_codec_err_t>
            (local_28,"expected_res_","res_dec",&this->expected_res_,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    __s = aom_codec_error_detail(&decoder->decoder_);
    if (__s == (char *)0x0) {
      __s = aom_codec_error(&decoder->decoder_);
    }
    poVar3 = (ostream *)(local_38._M_head_impl + 0x10);
    if (__s == (char *)0x0) {
      sVar2 = 6;
      __s = "(null)";
    }
    else {
      sVar2 = strlen(__s);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
    if (local_20 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
               ,0x165,(char *)message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(local_20);
  }
  bVar1 = testing::Test::HasFatalFailure();
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = testing::Test::HasNonfatalFailure();
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool HandleDecodeResult(const aom_codec_err_t res_dec,
                          libaom_test::Decoder *decoder) override {
    EXPECT_EQ(expected_res_, res_dec) << decoder->DecodeError();
    return !::testing::Test::HasFailure();
  }